

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::is_exclusive_sequence
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,size_type cur)

{
  pointer prVar1;
  re_state_type rVar2;
  pointer prVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  anon_union_4_2_4b30c3bf_for_re_state_0 local_80;
  anon_union_4_2_4b30c3bf_for_re_state_0 aStack_7c;
  pointer local_78;
  size_type local_70;
  undefined1 auStack_68 [8];
  range_pairs nextchar_class;
  undefined1 auStack_48 [8];
  range_pairs curchar_class;
  
  prVar3 = (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).NFA_states.buffer_;
  prVar1 = prVar3 + cur;
  curchar_class.rparray_.size_ = 0;
  nextchar_class.rparray_.size_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  curchar_class.rparray_.buffer_ = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  nextchar_class.rparray_.buffer_ = (pointer)0x0;
  rVar2 = prVar3[cur].type;
  if (rVar2 == st_character_class) {
    re_character_class::operator[]
              ((range_pairs *)&local_80,
               &(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class,
               (prVar1->field_0).number);
    auStack_48 = (undefined1  [8])CONCAT44(aStack_7c.character,local_80.character);
    curchar_class.rparray_.buffer_ = local_78;
    curchar_class.rparray_.size_ = local_70;
    if (local_78 == (pointer)0x0) {
      bVar6 = 1;
      goto LAB_001a6c88;
    }
LAB_001a6c20:
    bVar4 = gather_nextchars(this,(range_pairs *)auStack_68,cur + 1,0,true);
    if (nextchar_class.rparray_.buffer_ != (pointer)0x0) {
      bVar5 = range_pairs::is_overlap((range_pairs *)auStack_48,(range_pairs *)auStack_68);
      if (!bVar5) {
        bVar6 = !bVar4 | (prVar1->quantifier).field_2.is_greedy;
        goto LAB_001a6c88;
      }
      if (nextchar_class.rparray_.buffer_ != (pointer)0x0) goto LAB_001a6c75;
    }
    if (bVar4) {
      bVar4 = only_success_left(this,cur + 1);
      if (!bVar4) goto LAB_001a6c75;
    }
    bVar6 = (prVar1->quantifier).field_2.is_greedy;
  }
  else {
    if (rVar2 == st_character) {
      local_80 = prVar1->field_0;
      aStack_7c = local_80;
      range_pairs::join((range_pairs *)auStack_48,(range_pair *)&local_80);
      goto LAB_001a6c20;
    }
LAB_001a6c75:
    bVar6 = 0;
  }
LAB_001a6c88:
  free((void *)auStack_68);
  free((void *)auStack_48);
  return (bool)(bVar6 & 1);
}

Assistant:

bool is_exclusive_sequence(const typename state_array::size_type cur) const
	{
		const state_type &curstate = this->NFA_states[cur];
		range_pairs curchar_class;
		range_pairs nextchar_class;

		if (curstate.type == st_character)
		{
			curchar_class.join(range_pair_helper(curstate.character));
		}
		else if (curstate.type == st_character_class)
		{
			curchar_class = this->character_class[curstate.number];
			if (curchar_class.size() == 0)	//  Means [], which always makes matching fail.
				return true;	//  For preventing the automaton from pushing bt data.
		}
		else
		{
			return false;
		}

		const bool canbe0length = gather_nextchars(nextchar_class, cur + 1, 0u, true);

		if (nextchar_class.size() && !curchar_class.is_overlap(nextchar_class))
		{
			return !canbe0length || curstate.quantifier.is_greedy;
		}
		else if (nextchar_class.size() == 0 && (!canbe0length || only_success_left(cur + 1)))
		{
			//  (size() == 0 && !canbe0length) means [].
			return curstate.quantifier.is_greedy;
		}

		return false;
	}